

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingEventExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockingEventExpression,slang::ast::Type_const&,slang::ast::TimingControl&,slang::SourceRange&>
          (BumpAllocator *this,Type *args,TimingControl *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  ClockingEventExpression *pCVar1;
  TimingControl *in_RCX;
  Type *in_RDX;
  ClockingEventExpression *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pCVar1 = (ClockingEventExpression *)
           allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  slang::ast::ClockingEventExpression::ClockingEventExpression(in_RSI,in_RDX,in_RCX,sourceRange);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }